

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O2

int fy_atom_memcmp(fy_atom *atom,void *ptr,size_t len)

{
  uint uVar1;
  uint uVar2;
  char *__s1;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  fy_atom_iter iter;
  
  if ((atom == (fy_atom *)0x0 && ptr == (void *)0x0) && len == 0) {
    return 0;
  }
  if (ptr == (void *)0x0 && len == 0 || atom != (fy_atom *)0x0) {
    if ((ptr == (void *)0x0 || len == 0) && atom != (fy_atom *)0x0) {
      uVar2 = 1;
    }
    else if ((atom->field_0x35 & 4) == 0) {
      fy_atom_iter_start(atom,&iter);
      sVar3 = 0;
      uVar2 = 0xffffffff;
      while( true ) {
        uVar1 = fy_atom_iter_getc(&iter);
        bVar5 = len != sVar3;
        if (((int)uVar1 < 0) || (len == sVar3)) goto LAB_0013a7a8;
        uVar2 = (uint)*(byte *)((long)ptr + sVar3);
        if (uVar1 != *(byte *)((long)ptr + sVar3)) break;
        sVar3 = sVar3 + 1;
        uVar2 = uVar1;
      }
      bVar5 = true;
LAB_0013a7a8:
      fy_atom_iter_finish(&iter);
      if ((bool)(uVar1 != 0xffffffff | bVar5)) {
        uVar2 = (uint)((int)uVar2 <= (int)uVar1) * 2 - 1;
      }
      else {
        uVar2 = 0;
      }
    }
    else {
      uVar4 = (atom->end_mark).input_pos - (atom->start_mark).input_pos;
      __s1 = fy_atom_data(atom);
      sVar3 = len;
      if (uVar4 < len) {
        sVar3 = uVar4;
      }
      uVar2 = memcmp(__s1,ptr,sVar3);
      if (uVar2 == 0) {
        uVar2 = -(uint)(uVar4 < len) | 1;
        if (uVar4 == len) {
          uVar2 = 0;
        }
      }
    }
  }
  else {
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

int fy_atom_memcmp(struct fy_atom *atom, const void *ptr, size_t len) {
    const char *dstr, *str;
    size_t dlen, tlen;
    struct fy_atom_iter iter;
    int c, ct, ret;

    /* empty? just fine */
    if (!atom && !ptr && !len)
        return 0;

    /* empty atom but not ptr */
    if (!atom && (ptr || len))
        return -1;

    /* non empty atom and empty ptr */
    if (atom && (!ptr || !len))
        return 1;

    /* direct output, nice */
    if (atom->direct_output) {
        dlen = fy_atom_size(atom);
        dstr = fy_atom_data(atom);
        tlen = dlen > len ? len : dlen;
        ret = memcmp(dstr, ptr, tlen);
        if (ret)
            return ret;

        return dlen == len ? 0 : len > dlen ? -1 : 1;
    }

    str = ptr;
    ct = -1;
    fy_atom_iter_start(atom, &iter);
    while ((c = fy_atom_iter_getc(&iter)) >= 0 && len) {
        ct = *str & 0xff;
        if (ct != c)
            break;
        str++;
        len--;
    }
    fy_atom_iter_finish(&iter);

    /* out of data on both */
    if (c == -1 && !len)
        return 0;

    return ct > c ? -1 : 1;
}